

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O0

vm_obj_id_t
CVmObjIterIdx::create_for_coll(vm_val_t *coll,long first_valid_index,long last_valid_index)

{
  vm_obj_id_t vVar1;
  vm_val_t *in_RDX;
  CVmObjIterIdx *in_RSI;
  vm_val_t *in_RDI;
  vm_obj_id_t id;
  undefined4 in_stack_ffffffffffffffd8;
  vm_obj_id_t in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  CVmStack::push(in_RDI);
  vVar1 = vm_new_id(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  CVmObject::operator_new(CONCAT44(vVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  CVmObjIterIdx(in_RSI,in_RDX,CONCAT44(vVar1,in_stack_ffffffffffffffe0),
                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  CVmStack::discard();
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjIterIdx::create_for_coll(VMG_ const vm_val_t *coll,
                                           long first_valid_index,
                                           long last_valid_index)
{
    vm_obj_id_t id;

    /* push the collection object reference for gc protection */
    G_stk->push(coll);

    /* create a non-root-set object */
    id = vm_new_id(vmg_ FALSE, TRUE, FALSE);

    /* instantiate the iterator */
    new (vmg_ id) CVmObjIterIdx(vmg_ coll, first_valid_index,
                                last_valid_index);

    /* done with the gc protection */
    G_stk->discard();

    /* return the new object's ID */
    return id;
}